

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O0

bool util::anon_unknown_0::is_ascii(string *data)

{
  bool bVar1;
  bool bVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cur;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cur_00;
  type puVar3;
  char c;
  bool _foreach_continue240;
  auto_any_t _foreach_end240;
  auto_any_t _foreach_cur240;
  auto_any_t _foreach_col240;
  undefined5 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbd;
  byte bVar4;
  byte in_stack_ffffffffffffffbe;
  bool in_stack_ffffffffffffffbf;
  type2type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::bool_<true>_>
  *in_stack_ffffffffffffffc0;
  auto_any_t in_stack_ffffffffffffffc8;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
  *local_18;
  
  local_20 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             boost::foreach_detail_::contain<std::__cxx11::string_const>
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_ffffffffffffffc8,(false_ *)in_stack_ffffffffffffffc0);
  local_18 = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              *)&local_20;
  bVar1 = boost::iostreams::detail::
          indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
          ::can_write(local_18);
  if (!bVar1) {
    cur._M_current =
         (char *)boost::foreach_detail_::begin<std::__cxx11::string,mpl_::bool_<true>>
                           (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            (false_ *)
                            CONCAT17(in_stack_ffffffffffffffbf,
                                     CONCAT16(in_stack_ffffffffffffffbe,
                                              CONCAT15(in_stack_ffffffffffffffbd,
                                                       in_stack_ffffffffffffffb8))));
    bVar1 = boost::iostreams::detail::
            indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
            ::can_write((indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
                         *)&stack0xffffffffffffffd0);
    if (!bVar1) {
      cur_00._M_current =
           (char *)boost::foreach_detail_::end<std::__cxx11::string,mpl_::bool_<true>>
                             (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                              (false_ *)
                              CONCAT17(in_stack_ffffffffffffffbf,
                                       CONCAT16(in_stack_ffffffffffffffbe,
                                                CONCAT15(in_stack_ffffffffffffffbd,
                                                         in_stack_ffffffffffffffb8))));
      this = (indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              *)&stack0xffffffffffffffc0;
      bVar1 = boost::iostreams::detail::
              indirect_streambuf<boost::iostreams::basic_null_device<char,boost::iostreams::input>,std::char_traits<char>,std::allocator<char>,boost::iostreams::input>
              ::can_write(this);
      if (!bVar1) {
        bVar1 = true;
        while( true ) {
          bVar4 = 0;
          if ((bVar1 & 1U) != 0) {
            bVar2 = boost::foreach_detail_::done<std::__cxx11::string,mpl_::bool_<true>>
                              ((auto_any_t)cur._M_current,(auto_any_t)this,
                               (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                *)cur_00._M_current);
            bVar4 = bVar2 ^ 0xff;
          }
          if ((bVar4 & 1) == 0) break;
          bVar2 = boost::foreach_detail_::set_false((bool *)&stack0xffffffffffffffbf);
          if (!bVar2) {
            puVar3 = boost::foreach_detail_::deref<std::__cxx11::string,mpl_::bool_<true>>
                               ((auto_any_t)cur_00._M_current,
                                (type2type<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_mpl_::bool_<true>_>
                                 *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffbe,
                                                           CONCAT15(bVar4,in_stack_ffffffffffffffb8)
                                                          )));
            in_stack_ffffffffffffffbe = (byte)*puVar3;
            while (((bVar1 ^ 0xffU) & 1) != 0) {
              if (0x7f < in_stack_ffffffffffffffbe) {
                return false;
              }
              bVar1 = true;
            }
          }
          if ((bVar1 & 1U) != 0) {
            boost::foreach_detail_::next<std::__cxx11::string,mpl_::bool_<true>>
                      ((auto_any_t)cur_00._M_current,
                       (type2type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::bool_<true>_>
                        *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffbe,
                                                  CONCAT15(bVar4,in_stack_ffffffffffffffb8))));
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool is_ascii(const std::string & data) {
	// String in an extended ASCII encoding contains only ASCII characters
	BOOST_FOREACH(char c, data) {
		if(boost::uint8_t(c) >= 128) {
			return false;
		}
	}
	return true;
}